

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

void Cec_ManSimFindBestPattern(Cec_ManSim_t *p)

{
  Abc_Cex_t *pAVar1;
  Gia_Man_t *pGVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  if (p->nWords < 1) {
    iVar5 = 1;
    iVar10 = 0;
  }
  else {
    uVar7 = p->nWords * 0x20;
    uVar6 = 1;
    if ((int)uVar7 < 2) {
      uVar7 = 1;
    }
    uVar11 = 0;
    iVar9 = 0;
    do {
      iVar5 = p->pScores[uVar11];
      iVar10 = iVar9;
      if (iVar9 <= iVar5) {
        iVar10 = iVar5;
      }
      if (iVar9 < iVar5) {
        uVar6 = uVar11 & 0xffffffff;
      }
      iVar5 = (int)uVar6;
      uVar11 = uVar11 + 1;
      iVar9 = iVar10;
    } while (uVar7 != uVar11);
  }
  pAVar1 = p->pBestState;
  if (pAVar1->iPo <= iVar10) {
    iVar9 = pAVar1->nRegs;
    pGVar2 = p->pAig;
    if (iVar9 != pGVar2->nRegs) {
      __assert_fail("p->pBestState->nRegs == Gia_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x232,"void Cec_ManSimFindBestPattern(Cec_ManSim_t *)");
    }
    if (0 < iVar9) {
      pVVar3 = p->vCiSimInfo;
      pVVar4 = pGVar2->vCis;
      uVar7 = 0;
      do {
        uVar8 = (pVVar4->nSize - iVar9) + uVar7;
        if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (((*(uint *)((long)pVVar3->pArray[uVar8] + (long)(iVar5 >> 5) * 4) >>
              ((byte)iVar5 & 0x1f) ^ (uint)(&pAVar1[1].iPo)[uVar7 >> 5] >> (sbyte)(uVar7 & 0x1f)) &
            1) != 0) {
          (&pAVar1[1].iPo)[uVar7 >> 5] = (&pAVar1[1].iPo)[uVar7 >> 5] ^ 1 << (uVar7 & 0x1f);
          iVar9 = pGVar2->nRegs;
        }
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < iVar9);
    }
    pAVar1->iPo = iVar10;
  }
  return;
}

Assistant:

void Cec_ManSimFindBestPattern( Cec_ManSim_t * p )
{ 
    unsigned * pInfo;
    int i, ScoreBest = 0, iPatBest = 1; // set the first pattern
    // find the best pattern
    for ( i = 0; i < 32 * p->nWords; i++ )
        if ( ScoreBest < p->pScores[i] )
        {
            ScoreBest = p->pScores[i];
            iPatBest = i;
        }
    // compare this with the available patterns - and save
    if ( p->pBestState->iPo <= ScoreBest )
    {
        assert( p->pBestState->nRegs == Gia_ManRegNum(p->pAig) );
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            if ( Abc_InfoHasBit(p->pBestState->pData, i) != Abc_InfoHasBit(pInfo, iPatBest) )
                Abc_InfoXorBit( p->pBestState->pData, i );
        }
        p->pBestState->iPo = ScoreBest;
    }
}